

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

bool SHA1_ValidateHelper(char *str,ON__UINT8 *standard)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ON__UINT64 sizeof_buffer;
  int j;
  ON__UINT64 sizeof_buffer_00;
  int i;
  ON__UINT64 sizeof_buffer_01;
  char *local_f8;
  ON_SHA1_Hash sha1_digest;
  ON_SHA1 local_c8;
  ON_SHA1_Hash sha1_digest1;
  
  iVar2 = ON_String::Length(str);
  local_c8.m_state[2] = 0;
  local_c8.m_state[3] = 0;
  local_c8.m_state[4] = 0;
  local_c8.m_bit_count[0] = 0;
  local_c8.m_bit_count[1] = 0;
  local_c8.m_state[0] = 0;
  local_c8.m_state[1] = 0;
  local_c8.m_buffer[0x30] = '\0';
  local_c8.m_buffer[0x31] = '\0';
  local_c8.m_buffer[0x32] = '\0';
  local_c8.m_buffer[0x33] = '\0';
  local_c8.m_buffer[0x34] = '\0';
  local_c8.m_buffer[0x35] = '\0';
  local_c8.m_buffer[0x36] = '\0';
  local_c8.m_buffer[0x37] = '\0';
  local_c8.m_buffer[0x38] = '\0';
  local_c8.m_buffer[0x39] = '\0';
  local_c8.m_buffer[0x3a] = '\0';
  local_c8.m_buffer[0x3b] = '\0';
  local_c8.m_buffer[0x3c] = '\0';
  local_c8.m_buffer[0x3d] = '\0';
  local_c8.m_buffer[0x3e] = '\0';
  local_c8.m_buffer[0x3f] = '\0';
  local_c8.m_buffer[0x20] = '\0';
  local_c8.m_buffer[0x21] = '\0';
  local_c8.m_buffer[0x22] = '\0';
  local_c8.m_buffer[0x23] = '\0';
  local_c8.m_buffer[0x24] = '\0';
  local_c8.m_buffer[0x25] = '\0';
  local_c8.m_buffer[0x26] = '\0';
  local_c8.m_buffer[0x27] = '\0';
  local_c8.m_buffer[0x28] = '\0';
  local_c8.m_buffer[0x29] = '\0';
  local_c8.m_buffer[0x2a] = '\0';
  local_c8.m_buffer[0x2b] = '\0';
  local_c8.m_buffer[0x2c] = '\0';
  local_c8.m_buffer[0x2d] = '\0';
  local_c8.m_buffer[0x2e] = '\0';
  local_c8.m_buffer[0x2f] = '\0';
  local_c8.m_buffer[0x10] = '\0';
  local_c8.m_buffer[0x11] = '\0';
  local_c8.m_buffer[0x12] = '\0';
  local_c8.m_buffer[0x13] = '\0';
  local_c8.m_buffer[0x14] = '\0';
  local_c8.m_buffer[0x15] = '\0';
  local_c8.m_buffer[0x16] = '\0';
  local_c8.m_buffer[0x17] = '\0';
  local_c8.m_buffer[0x18] = '\0';
  local_c8.m_buffer[0x19] = '\0';
  local_c8.m_buffer[0x1a] = '\0';
  local_c8.m_buffer[0x1b] = '\0';
  local_c8.m_buffer[0x1c] = '\0';
  local_c8.m_buffer[0x1d] = '\0';
  local_c8.m_buffer[0x1e] = '\0';
  local_c8.m_buffer[0x1f] = '\0';
  local_c8.m_buffer[0] = '\0';
  local_c8.m_buffer[1] = '\0';
  local_c8.m_buffer[2] = '\0';
  local_c8.m_buffer[3] = '\0';
  local_c8.m_buffer[4] = '\0';
  local_c8.m_buffer[5] = '\0';
  local_c8.m_buffer[6] = '\0';
  local_c8.m_buffer[7] = '\0';
  local_c8.m_buffer[8] = '\0';
  local_c8.m_buffer[9] = '\0';
  local_c8.m_buffer[10] = '\0';
  local_c8.m_buffer[0xb] = '\0';
  local_c8.m_buffer[0xc] = '\0';
  local_c8.m_buffer[0xd] = '\0';
  local_c8.m_buffer[0xe] = '\0';
  local_c8.m_buffer[0xf] = '\0';
  local_c8.m_byte_count = 0;
  local_c8.m_status_bits = 0;
  local_c8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_c8.m_sha1_hash);
  sizeof_buffer = (ON__UINT64)iVar2;
  ON_SHA1::AccumulateBytes(&local_c8,str,sizeof_buffer);
  ON_SHA1::Hash(&sha1_digest,&local_c8);
  iVar3 = bcmp(standard,&sha1_digest,0x14);
  if (iVar3 == 0) {
    bVar1 = true;
    sizeof_buffer_01 = 0;
    local_f8 = str;
    while (((long)sizeof_buffer_01 <= (long)sizeof_buffer && (bVar1 != false))) {
      sizeof_buffer_00 = 0;
      iVar3 = iVar2;
      while (((long)(sizeof_buffer_01 + sizeof_buffer_00) <= (long)sizeof_buffer && (bVar1 != false)
             )) {
        local_c8.m_byte_count = 0;
        local_c8.m_bit_count[0] = 0;
        local_c8.m_bit_count[1] = 0;
        local_c8.m_state[0] = 0x67452301;
        local_c8.m_state[1] = 0xefcdab89;
        local_c8.m_state[2] = 0x98badcfe;
        local_c8.m_state[3] = 0x10325476;
        local_c8.m_state[4] = 0xc3d2e1f0;
        local_c8.m_status_bits = 1;
        ON_SHA1::AccumulateBytes(&local_c8,str,sizeof_buffer_01);
        ON_SHA1::Hash(&sha1_digest1,&local_c8);
        ON_SHA1::AccumulateBytes(&local_c8,str + sizeof_buffer_01,sizeof_buffer_00);
        ON_SHA1::Hash(&sha1_digest1,&local_c8);
        ON_SHA1::AccumulateBytes(&local_c8,local_f8 + sizeof_buffer_00,(long)iVar3);
        ON_SHA1::Hash(&sha1_digest1,&local_c8);
        bVar1 = operator==(&sha1_digest,&sha1_digest1);
        sizeof_buffer_00 = sizeof_buffer_00 + 1;
        iVar3 = iVar3 + -1;
      }
      sizeof_buffer_01 = sizeof_buffer_01 + 1;
      local_f8 = local_f8 + 1;
      iVar2 = iVar2 + -1;
    }
    bVar4 = false;
    if (local_c8.m_byte_count == sizeof_buffer) {
      bVar4 = bVar1;
    }
    if (bVar1 == false) {
      bVar4 = bVar1;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool SHA1_ValidateHelper(
  const char* str,
  const ON__UINT8 standard[20]
  )
{
  const int str_length = ON_String::Length(str);
  ON_SHA1 sha1;
  sha1.AccumulateBytes(str, str_length);
  const ON_SHA1_Hash sha1_digest(sha1.Hash());
  if ( 0 != memcmp(standard, &sha1_digest, 20) )
    return false;

  bool rc = true;
  for (int i = 0; i <= str_length && rc; i++)
  {
    for (int j = 0; i+j <= str_length && rc; j++)
    {
      sha1.Reset();
      sha1.AccumulateBytes(str, i);
      sha1.Hash();
      sha1.AccumulateBytes(str+i, j);
      sha1.Hash();
      sha1.AccumulateBytes(str+i+j, str_length-i-j);
      ON_SHA1_Hash sha1_digest1(sha1.Hash());
      rc = ( sha1_digest == sha1_digest1 );
    }
  }

  if (rc)
  {
    if ( (ON__UINT64)str_length != sha1.ByteCount() )
      rc = false;
  }

  return rc;
}